

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>::Args>_>
::initPrograms(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>::Args,_vkt::NoPrograms1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>::Args>_>
               *this,SourceCollections *dst)

{
  vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> local_20;
  
  std::vector<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::vector
            (&local_20,&(this->m_arg0).arg0.poolSizes);
  if (local_20.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Args (Function func_, Arg0 arg0_) : func(func_), arg0(arg0_) {}